

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::stringify<C_A_T_C_H_T_E_S_T_160()::t1>
          (string *__return_storage_ptr__,Detail *this,t1 *e)

{
  ReusableStringStream rss;
  ReusableStringStream local_30;
  
  ReusableStringStream::ReusableStringStream(&local_30);
  std::operator<<(local_30.m_oss,(char)*this);
  ReusableStringStream::str_abi_cxx11_((string *)__return_storage_ptr__,&local_30);
  ReusableStringStream::~ReusableStringStream(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<typename std::remove_cv<typename std::remove_reference<T>::type>::type>::convert(e);
        }